

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_extract.cpp
# Opt level: O2

void duckdb::MapExtractValueFunc(DataChunk *args,ExpressionState *state,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  reference list_v;
  reference target_v;
  Vector *source_v;
  Vector *pVVar2;
  list_entry_t *plVar3;
  UnifiedVectorFormat *pUVar4;
  UnifiedVectorFormat *pUVar5;
  long lVar6;
  idx_t row_idx;
  UnifiedVectorFormat *row_idx_00;
  LogicalType local_140 [24];
  UnifiedVectorFormat pos_format;
  long local_120;
  long local_118;
  UnifiedVectorFormat lst_format;
  long local_d0;
  Vector pos_vec;
  
  pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
  list_v = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  target_v = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  if ((list_v[8] != (value_type)0x1) && (target_v[8] != (value_type)0x1)) {
    source_v = (Vector *)duckdb::MapVector::GetKeys(list_v);
    pVVar2 = (Vector *)duckdb::MapVector::GetValues(list_v);
    duckdb::LogicalType::LogicalType(local_140,INTEGER);
    duckdb::Vector::Vector(&pos_vec,local_140,pUVar1);
    duckdb::LogicalType::~LogicalType(local_140);
    ListSearchOp<true>(list_v,source_v,target_v,&pos_vec,*(idx_t *)(args + 0x18));
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&pos_format);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&lst_format);
    duckdb::Vector::ToUnifiedFormat((ulong)&pos_vec,pUVar1);
    duckdb::Vector::ToUnifiedFormat((ulong)list_v,pUVar1);
    plVar3 = ListVector::GetData(list_v);
    FlatVector::VerifyFlatVector(result);
    for (row_idx_00 = (UnifiedVectorFormat *)0x0; pUVar1 != row_idx_00; row_idx_00 = row_idx_00 + 1)
    {
      pUVar4 = row_idx_00;
      if (*_lst_format != 0) {
        pUVar4 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_lst_format + (long)row_idx_00 * 4);
      }
      if ((local_d0 == 0) ||
         ((*(ulong *)(local_d0 + ((ulong)pUVar4 >> 6) * 8) >> ((ulong)pUVar4 & 0x3f) & 1) != 0)) {
        pUVar5 = row_idx_00;
        if (*_pos_format != 0) {
          pUVar5 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_pos_format + (long)row_idx_00 * 4);
        }
        if ((local_118 == 0) ||
           ((*(ulong *)(local_118 + ((ulong)pUVar5 >> 6) * 8) >> ((ulong)pUVar5 & 0x3f) & 1) != 0))
        {
          lVar6 = (long)*(int *)(local_120 + (long)pUVar5 * 4);
          duckdb::VectorOperations::Copy
                    (pVVar2,result,lVar6 + plVar3[(long)pUVar4].offset,
                     (lVar6 + plVar3[(long)pUVar4].offset) - 1,(ulong)row_idx_00);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)row_idx_00);
        }
      }
      else {
        duckdb::FlatVector::SetNull(result,(ulong)row_idx_00,true);
      }
    }
    if (*(long *)(args + 0x18) == 1) {
      duckdb::Vector::SetVectorType((VectorType)result);
    }
    duckdb::Vector::Verify((ulong)result);
    UnifiedVectorFormat::~UnifiedVectorFormat(&lst_format);
    UnifiedVectorFormat::~UnifiedVectorFormat(&pos_format);
    Vector::~Vector(&pos_vec);
    return;
  }
  duckdb::Vector::SetVectorType((VectorType)result);
  duckdb::ConstantVector::SetNull(result,true);
  duckdb::Vector::Verify((ulong)result);
  return;
}

Assistant:

static void MapExtractValueFunc(DataChunk &args, ExpressionState &state, Vector &result) {
	const auto count = args.size();

	auto &map_vec = args.data[0];
	auto &arg_vec = args.data[1];

	const auto map_is_null = map_vec.GetType().id() == LogicalTypeId::SQLNULL;
	const auto arg_is_null = arg_vec.GetType().id() == LogicalTypeId::SQLNULL;

	if (map_is_null || arg_is_null) {
		// Short-circuit if either the map or the arg is NULL
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		result.Verify(count);
		return;
	}

	auto &key_vec = MapVector::GetKeys(map_vec);
	auto &val_vec = MapVector::GetValues(map_vec);

	// Collect the matching positions
	Vector pos_vec(LogicalType::INTEGER, count);
	ListSearchOp<true>(map_vec, key_vec, arg_vec, pos_vec, args.size());

	UnifiedVectorFormat pos_format;
	UnifiedVectorFormat lst_format;

	pos_vec.ToUnifiedFormat(count, pos_format);
	map_vec.ToUnifiedFormat(count, lst_format);

	const auto pos_data = UnifiedVectorFormat::GetData<int32_t>(pos_format);
	const auto inc_list_data = ListVector::GetData(map_vec);

	auto &result_validity = FlatVector::Validity(result);
	for (idx_t row_idx = 0; row_idx < count; row_idx++) {
		auto lst_idx = lst_format.sel->get_index(row_idx);
		if (!lst_format.validity.RowIsValid(lst_idx)) {
			FlatVector::SetNull(result, row_idx, true);
			continue;
		}

		const auto pos_idx = pos_format.sel->get_index(row_idx);
		if (!pos_format.validity.RowIsValid(pos_idx)) {
			// We didnt find the key in the map, so return NULL
			result_validity.SetInvalid(row_idx);
			continue;
		}

		// Compute the actual position of the value in the map value vector
		const auto pos = inc_list_data[lst_idx].offset + UnsafeNumericCast<idx_t>(pos_data[pos_idx] - 1);
		VectorOperations::Copy(val_vec, result, pos + 1, pos, row_idx);
	}

	if (args.size() == 1) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}

	result.Verify(count);
}